

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

float ImGui::ScaleRatioFromValueT<long_long,long_long,double>
                (ImGuiDataType data_type,longlong v,longlong v_min,longlong v_max,
                bool is_logarithmic,float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  long lVar6;
  longlong lVar7;
  longlong lVar8;
  bool bVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  double dVar13;
  undefined1 in_register_00001204 [60];
  undefined1 auVar15 [64];
  float fVar16;
  undefined1 auVar17 [16];
  undefined8 in_XMM3_Qa;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 in_XMM7_Qa;
  double dVar20;
  undefined1 auVar21 [16];
  undefined4 in_XMM8_Db;
  undefined8 in_XMM8_Qb;
  
  auVar15._4_60_ = in_register_00001204;
  auVar15._0_4_ = logarithmic_zero_epsilon;
  fVar16 = 0.0;
  lVar6 = v_max - v_min;
  if (lVar6 != 0) {
    lVar5 = v_max;
    if (v_max < v_min) {
      lVar5 = v_min;
    }
    lVar8 = v_max;
    if (lVar6 != 0 && v_min <= v_max) {
      lVar8 = v_min;
    }
    if (v < lVar5) {
      lVar5 = v;
    }
    if (v < lVar8) {
      lVar5 = lVar8;
    }
    if (is_logarithmic) {
      auVar11._8_4_ = 0x80000000;
      auVar11._0_8_ = 0x8000000080000000;
      auVar11._12_4_ = 0x80000000;
      auVar11 = vxorps_avx512vl(auVar15._0_16_,auVar11);
      auVar19._0_8_ = (double)logarithmic_zero_epsilon;
      auVar19._8_8_ = in_register_00001204._4_8_;
      lVar8 = v_min;
      if (v_min < v_max) {
        lVar8 = v_max;
      }
      lVar7 = v_min;
      if (v_max < v_min) {
        lVar7 = v_max;
      }
      auVar18._0_8_ = (double)lVar8;
      auVar18._8_8_ = in_XMM3_Qa;
      auVar12._8_4_ = 0xffffffff;
      auVar12._0_8_ = 0x7fffffffffffffff;
      auVar12._12_4_ = 0x7fffffff;
      auVar12 = vandpd_avx512vl(auVar18,auVar12);
      bVar9 = lVar8 < 0;
      fVar16 = auVar11._0_4_;
      uVar1 = vcmpsd_avx512f(auVar12,auVar19,1);
      bVar2 = (bool)((byte)uVar1 & 1);
      dVar10 = (double)((ulong)bVar2 *
                        (long)(double)(float)((uint)bVar9 * (int)fVar16 +
                                             (uint)!bVar9 * (int)logarithmic_zero_epsilon) +
                       (ulong)!bVar2 * (long)auVar18._0_8_);
      if (lVar7 == 0 && bVar9) {
        dVar20 = (double)fVar16;
      }
      else {
        auVar21._0_8_ = (double)lVar7;
        auVar21._8_8_ = in_XMM7_Qa;
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0x7fffffffffffffff;
        auVar4._12_4_ = 0x7fffffff;
        auVar11 = vandpd_avx512vl(auVar21,auVar4);
        bVar9 = lVar7 < 0;
        uVar1 = vcmpsd_avx512f(auVar11,auVar19,1);
        bVar2 = (bool)((byte)uVar1 & 1);
        dVar20 = (double)((ulong)bVar2 *
                          (long)(double)(float)((uint)bVar9 * (int)fVar16 +
                                               (uint)!bVar9 * (int)logarithmic_zero_epsilon) +
                         (ulong)!bVar2 * (long)auVar21._0_8_);
        dVar10 = (double)((ulong)(lVar8 == 0) *
                          ((ulong)bVar9 * (long)(double)fVar16 + (ulong)!bVar9 * (long)dVar10) +
                         (ulong)(lVar8 != 0) * (long)dVar10);
      }
      dVar13 = (double)lVar5;
      fVar16 = 0.0;
      if (dVar20 < dVar13) {
        if (dVar10 <= dVar13) {
          fVar16 = 1.0;
        }
        else if (v_max * v_min < 0) {
          auVar17._0_4_ = (float)lVar7;
          auVar17._8_8_ = in_XMM8_Qb;
          auVar17._4_4_ = in_XMM8_Db;
          auVar3._8_4_ = 0x80000000;
          auVar3._0_8_ = 0x8000000080000000;
          auVar3._12_4_ = 0x80000000;
          auVar11 = vxorps_avx512vl(auVar17,auVar3);
          fVar16 = auVar11._0_4_ / ((float)lVar8 - auVar17._0_4_);
          if (v != 0) {
            if (v < 0) {
              dVar10 = log(-dVar13 / auVar19._0_8_);
              dVar20 = log(-dVar20 / auVar19._0_8_);
              fVar16 = (1.0 - (float)(dVar10 / dVar20)) * (fVar16 - zero_deadzone_halfsize);
            }
            else {
              dVar20 = log(dVar13 / auVar19._0_8_);
              dVar10 = log(dVar10 / auVar19._0_8_);
              auVar14._0_4_ = (float)(dVar20 / dVar10);
              auVar14._4_4_ = (int)((ulong)(dVar20 / dVar10) >> 0x20);
              auVar14._8_8_ = 0;
              auVar11 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - (fVar16 + zero_deadzone_halfsize))),
                                        auVar14,ZEXT416((uint)(fVar16 + zero_deadzone_halfsize)));
              fVar16 = auVar11._0_4_;
            }
          }
        }
        else if ((v_max | v_min) < 0) {
          dVar13 = log(dVar13 / dVar10);
          dVar10 = log(dVar20 / dVar10);
          fVar16 = 1.0 - (float)(dVar13 / dVar10);
        }
        else {
          dVar13 = log(dVar13 / dVar20);
          dVar10 = log(dVar10 / dVar20);
          fVar16 = (float)(dVar13 / dVar10);
        }
      }
      fVar16 = (float)((uint)(v_max < v_min) * (int)(1.0 - fVar16) +
                      (uint)(v_max >= v_min) * (int)fVar16);
    }
    else {
      fVar16 = (float)((double)(lVar5 - v_min) / (double)lVar6);
    }
  }
  return fVar16;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}